

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

size_t xmi_process_multi(PBuffer *buffer,MidiFile *midi)

{
  Buffer *this;
  element_type *peVar1;
  element_type *this_00;
  Stream *this_01;
  size_t sVar2;
  undefined1 local_98 [24];
  string local_80 [32];
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  string name;
  PBuffer type;
  MidiFile *midi_local;
  PBuffer *buffer_local;
  
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  this = (Buffer *)((long)&name.field_2 + 8);
  Buffer::pop(this,(size_t)peVar1);
  this_00 = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)this);
  Buffer::operator_cast_to_string((string *)local_48,this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"xmi2mid",(allocator<char> *)(local_98 + 0x17));
  Log::Logger::operator[]((Logger *)local_60,(string *)&Log::Verbose);
  this_01 = Log::Stream::operator<<((Stream *)local_60,"\tchunk subtype: ");
  Log::Stream::operator<<
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  Log::Stream::~Stream((Stream *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)(local_98 + 0x17));
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  Buffer::get_tail((Buffer *)local_98,(size_t)peVar1);
  xmi_process_chunks((PBuffer *)local_98,midi);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_98);
  peVar1 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      buffer);
  sVar2 = Buffer::get_size(peVar1);
  std::__cxx11::string::~string((string *)local_48);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)((long)&name.field_2 + 8));
  return sVar2;
}

Assistant:

static size_t
xmi_process_multi(PBuffer buffer, MidiFile *midi) {
  PBuffer type = buffer->pop(4);
  std::string name = *type.get();
  Log::Verbose["xmi2mid"] << "\tchunk subtype: " << name;
  xmi_process_chunks(buffer->get_tail(4), midi);
  return buffer->get_size();
}